

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logmath.c
# Opt level: O2

logmath_t * logmath_read(char *file_name)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  int32 iVar4;
  int iVar5;
  uint uVar6;
  FILE *__stream;
  logmath_t *lmath;
  ulong uVar7;
  void *pvVar8;
  size_t sVar9;
  mmio_file_t *mf;
  char *fmt;
  char *pcVar10;
  long lVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar14;
  int32 byteswap;
  char **argval;
  uint32 chksum;
  undefined4 local_4c;
  char *local_48;
  FILE *local_40;
  char **argname;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/logmath.c"
          ,0xae,"Reading log table file \'%s\'\n",file_name);
  __stream = fopen(file_name,"rb");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/logmath.c"
                   ,0xb0,"Failed to open log table file \'%s\' for reading",file_name);
    return (logmath_t *)0x0;
  }
  iVar4 = bio_readhdr((FILE *)__stream,&argname,&argval,&byteswap);
  if (iVar4 < 0) {
    lmath = (logmath_t *)0x0;
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/logmath.c"
            ,0xb6,"Failed to read the header from the file \'%s\'\n",file_name);
    goto LAB_00105829;
  }
  local_48 = file_name;
  local_40 = __stream;
  lmath = (logmath_t *)
          __ckd_calloc__(1,0x50,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/logmath.c"
                         ,0xbb);
  (lmath->t).width = '\x02';
  (lmath->t).shift = '\0';
  lmath->base = 1.0001;
  lVar11 = 0;
  bVar3 = false;
  while( true ) {
    uVar14 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    pcVar10 = argname[lVar11];
    if (pcVar10 == (char *)0x0) break;
    iVar5 = strcmp(pcVar10,"version");
    if (iVar5 != 0) {
      iVar5 = strcmp(pcVar10,"chksum0");
      if (iVar5 == 0) {
        iVar5 = strcmp(argval[lVar11],"yes");
        if (iVar5 == 0) {
          bVar3 = true;
        }
      }
      else {
        iVar5 = strcmp(pcVar10,"width");
        if (iVar5 == 0) {
          iVar5 = atoi(argval[lVar11]);
          (lmath->t).width = (uint8)iVar5;
        }
        else {
          iVar5 = strcmp(pcVar10,"shift");
          if (iVar5 == 0) {
            iVar5 = atoi(argval[lVar11]);
            (lmath->t).shift = (int8)iVar5;
          }
          else {
            iVar5 = strcmp(pcVar10,"logbase");
            if (iVar5 == 0) {
              dVar12 = atof_c(argval[lVar11]);
              lmath->base = (float64)dVar12;
            }
          }
        }
      }
    }
    lVar11 = lVar11 + 1;
  }
  local_4c = (undefined4)lVar11;
  bio_hdrarg_free(argname,argval);
  chksum = 0;
  dVar12 = log((double)lmath->base);
  lmath->log_of_base = (float64)dVar12;
  dVar12 = log10((double)lmath->base);
  __stream = local_40;
  lmath->log10_of_base = (float64)dVar12;
  auVar13._8_8_ = dVar12;
  auVar13._0_8_ = lmath->log_of_base;
  auVar13 = divpd(_DAT_00110260,auVar13);
  lmath->inv_log_of_base = (float64)auVar13._0_8_;
  lmath->inv_log10_of_base = (float64)auVar13._8_8_;
  lmath->zero = -0x80000000 >> ((lmath->t).shift + 2U & 0x1f);
  iVar4 = bio_fread(&(lmath->t).table_size,4,1,(FILE *)local_40,byteswap,&chksum);
  if (iVar4 == 1) {
    uVar7 = ftell(__stream);
    pcVar10 = local_48;
    bVar1 = (lmath->t).width;
    if (((ulong)bVar1 - 1 & uVar7) == 0) {
      if (byteswap == 0) {
        mf = mmio_file_read(local_48);
        lmath->filemap = mf;
        pvVar8 = mmio_file_ptr(mf);
        (lmath->t).table = (void *)((long)pvVar8 + uVar7);
        goto LAB_00105829;
      }
LAB_0010572f:
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/logmath.c"
              ,0xef,"%s: Data is wrong-endian, will not memory map\n",pcVar10);
    }
    else {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/logmath.c"
              ,0xea,"%s: Data start %ld is not aligned on %d-byte boundary, will not memory map\n",
              local_48,uVar7,CONCAT44(uVar14,(uint)bVar1));
      if (byteswap != 0) goto LAB_0010572f;
    }
    pvVar8 = __ckd_calloc__((ulong)(lmath->t).table_size,(ulong)(lmath->t).width,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/logmath.c"
                            ,0xf8);
    (lmath->t).table = pvVar8;
    uVar6 = bio_fread(pvVar8,(uint)(lmath->t).width,(lmath->t).table_size,(FILE *)__stream,byteswap,
                      &chksum);
    uVar2 = (lmath->t).table_size;
    if (uVar6 != uVar2) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/logmath.c"
              ,0xfc,"Failed to read data (%d x %d bytes) from the file \'%s\' failed",(ulong)uVar2,
              (ulong)(lmath->t).width,pcVar10);
      goto LAB_00105800;
    }
    if (bVar3) {
      bio_verify_chksum((FILE *)__stream,byteswap,chksum);
    }
    sVar9 = fread(&local_4c,1,1,__stream);
    if (sVar9 != 1) {
LAB_00105829:
      fclose(__stream);
      return lmath;
    }
    fmt = "%s: More data than expected\n";
    lVar11 = 0x103;
  }
  else {
    fmt = "Failed to read values from the file \'%s\'";
    lVar11 = 0xe1;
    pcVar10 = local_48;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/logmath.c"
          ,lVar11,fmt,pcVar10);
LAB_00105800:
  logmath_free(lmath);
  return (logmath_t *)0x0;
}

Assistant:

logmath_t *
logmath_read(const char *file_name)
{
    logmath_t *lmath;
    char **argname, **argval;
    int32 byteswap, i;
    int chksum_present, do_mmap;
    uint32 chksum;
    long pos;
    FILE *fp;

    E_INFO("Reading log table file '%s'\n", file_name);
    if ((fp = fopen(file_name, "rb")) == NULL) {
        E_ERROR_SYSTEM("Failed to open log table file '%s' for reading", file_name);
        return NULL;
    }

    /* Read header, including argument-value info and 32-bit byteorder magic */
    if (bio_readhdr(fp, &argname, &argval, &byteswap) < 0) {
        E_ERROR("Failed to read the header from the file '%s'\n", file_name);
        fclose(fp);
        return NULL;
    }

    lmath = ckd_calloc(1, sizeof(*lmath));
    /* Default values. */
    lmath->t.shift = 0;
    lmath->t.width = 2;
    lmath->base = 1.0001;

    /* Parse argument-value list */
    chksum_present = 0;
    for (i = 0; argname[i]; i++) {
        if (strcmp(argname[i], "version") == 0) {
        }
        else if (strcmp(argname[i], "chksum0") == 0) {
            if (strcmp(argval[i], "yes") == 0)
                chksum_present = 1;
        }
        else if (strcmp(argname[i], "width") == 0) {
            lmath->t.width = atoi(argval[i]);
        }
        else if (strcmp(argname[i], "shift") == 0) {
            lmath->t.shift = atoi(argval[i]);
        }
        else if (strcmp(argname[i], "logbase") == 0) {
            lmath->base = atof_c(argval[i]);
        }
    }
    bio_hdrarg_free(argname, argval);
    chksum = 0;

    /* Set up various necessary constants. */
    lmath->log_of_base = log(lmath->base);
    lmath->log10_of_base = log10(lmath->base);
    lmath->inv_log_of_base = 1.0/lmath->log_of_base;
    lmath->inv_log10_of_base = 1.0/lmath->log10_of_base;
    /* Shift this sufficiently that overflows can be avoided. */
    lmath->zero = MAX_NEG_INT32 >> (lmath->t.shift + 2);

    /* #Values to follow */
    if (bio_fread(&lmath->t.table_size, sizeof(int32), 1, fp, byteswap, &chksum) != 1) {
        E_ERROR("Failed to read values from the file '%s'", file_name);
        goto error_out;
    }

    /* Check alignment constraints for memory mapping */
    do_mmap = 1;
    pos = ftell(fp);
    if (pos & ((long)lmath->t.width - 1)) {
        E_WARN("%s: Data start %ld is not aligned on %d-byte boundary, will not memory map\n",
                  file_name, pos, lmath->t.width);
        do_mmap = 0;
    }
    /* Check byte order for memory mapping */
    if (byteswap) {
        E_WARN("%s: Data is wrong-endian, will not memory map\n", file_name);
        do_mmap = 0;
    }

    if (do_mmap) {
        lmath->filemap = mmio_file_read(file_name);
        lmath->t.table = (char *)mmio_file_ptr(lmath->filemap) + pos;
    }
    else {
        lmath->t.table = ckd_calloc(lmath->t.table_size, lmath->t.width);
        if (bio_fread(lmath->t.table, lmath->t.width, lmath->t.table_size,
                      fp, byteswap, &chksum) != lmath->t.table_size) {
            E_ERROR("Failed to read data (%d x %d bytes) from the file '%s' failed",
                    lmath->t.table_size, lmath->t.width, file_name);
            goto error_out;
        }
        if (chksum_present)
            bio_verify_chksum(fp, byteswap, chksum);

        if (fread(&i, 1, 1, fp) == 1) {
            E_ERROR("%s: More data than expected\n", file_name);
            goto error_out;
        }
    }
    fclose(fp);

    return lmath;
error_out:
    logmath_free(lmath);
    return NULL;
}